

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O2

Matrix4d *
opengv::relative_pose::modules::ge::composeG
          (Matrix4d *__return_storage_ptr__,Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,
          Matrix3d *yzF,Matrix3d *zxF,Matrix<double,_3,_9,_0,_3,_9> *x1P,
          Matrix<double,_3,_9,_0,_3,_9> *y1P,Matrix<double,_3,_9,_0,_3,_9> *z1P,
          Matrix<double,_3,_9,_0,_3,_9> *x2P,Matrix<double,_3,_9,_0,_3,_9> *y2P,
          Matrix<double,_3,_9,_0,_3,_9> *z2P,Matrix<double,_9,_9,_0,_9,_9> *m11P,
          Matrix<double,_9,_9,_0,_9,_9> *m12P,Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *cayley)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  Scalar SVar5;
  Scalar SVar6;
  Scalar SVar7;
  Scalar SVar8;
  Scalar SVar9;
  Scalar SVar10;
  Scalar SVar11;
  Scalar SVar12;
  Scalar SVar13;
  Scalar SVar14;
  undefined1 local_350 [16];
  XprTypeNested local_340;
  variable_if_dynamic<long,__1> local_338;
  variable_if_dynamic<long,__1> vStack_330;
  Matrix<double,_9,_9,_0,_9,_9> *pMStack_328;
  Matrix3d *local_320;
  double *pdStack_318;
  undefined8 local_310;
  rotation_t *local_308;
  Matrix3d *local_300;
  double *local_2f8;
  undefined8 local_2f0;
  rotation_t *local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  rotation_t R;
  Vector3d yzFr0t;
  Vector3d y2PR;
  Vector3d x2PR;
  Vector3d z1PC;
  Vector3d y1PC;
  Vector3d zxFr2t;
  Vector3d zxFr1t;
  Vector3d xyFr2t;
  Vector3d xyFr1t;
  Vector3d zzFr0t;
  Vector3d yyFr0t;
  Vector3d xxFr1t;
  Vector3d x1PC;
  Vector3d z2PR;
  Matrix<double,_9,_1,_0,_9,_1> Rowst;
  Matrix<double,_1,_9,_1,_1,_9> Rows;
  Matrix<double,_9,_1,_0,_9,_1> Cols;
  
  math::cayley2rot_reduced(cayley);
  local_350._8_8_ =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
  vStack_330.m_value = 1;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x0;
  local_320 = (Matrix3d *)0x1;
  local_350._0_8_ = xxF;
  local_338.m_value = (long)&R;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&xxFr1t,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)local_350);
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x0;
  local_320 = (Matrix3d *)0x1;
  local_350._0_8_ = yyF;
  local_350._8_8_ = &R;
  local_338.m_value = (long)&R;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&yyFr0t,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)local_350);
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x0;
  local_320 = (Matrix3d *)0x1;
  local_350._0_8_ = zzF;
  local_350._8_8_ = &R;
  local_338.m_value = (long)&R;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&zzFr0t,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)local_350);
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x0;
  local_320 = (Matrix3d *)0x1;
  local_350._0_8_ = yzF;
  local_350._8_8_ = &R;
  local_338.m_value = (long)&R;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&yzFr0t,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)local_350);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  vStack_330.m_value = 1;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x0;
  local_320 = (Matrix3d *)0x1;
  local_350._0_8_ = xyF;
  local_350._8_8_ = pdVar1;
  local_338.m_value = (long)&R;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&xyFr1t,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)local_350);
  local_350._8_8_ =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  vStack_330.m_value = 2;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x0;
  local_320 = (Matrix3d *)0x1;
  local_350._0_8_ = xyF;
  local_338.m_value = (long)&R;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&xyFr2t,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)local_350);
  local_350._0_8_ = zxF;
  vStack_330.m_value = 1;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x0;
  local_320 = (Matrix3d *)0x1;
  local_350._8_8_ = pdVar1;
  local_338.m_value = (long)&R;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&zxFr1t,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)local_350);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  local_350._0_8_ = zxF;
  vStack_330.m_value = 2;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x0;
  local_320 = (Matrix3d *)0x1;
  local_350._8_8_ = pdVar1;
  local_338.m_value = (long)&R;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&zxFr2t,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)local_350);
  local_338.m_value = 2;
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_300 = (Matrix3d *)0x2;
  local_2f8 = (double *)0x0;
  local_2f0 = 1;
  local_350._0_8_ = pdVar1;
  local_340 = &R;
  local_320 = yyF;
  pdStack_318 = pdVar1;
  local_308 = &R;
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_340 = (XprTypeNested)0xc000000000000000;
  local_320 = (Matrix3d *)0x2;
  pdVar2 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  pdStack_318 = (double *)0x0;
  local_310 = 1;
  local_2e0 = 1;
  local_2d8 = 0;
  local_2d0 = 1;
  local_338.m_value = (long)pdVar1;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)&R;
  local_300 = yzF;
  local_2f8 = pdVar2;
  local_2e8 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_338.m_value = 1;
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_300 = (Matrix3d *)0x1;
  local_2f8 = (double *)0x0;
  local_2f0 = 1;
  local_350._0_8_ = pdVar2;
  local_340 = &R;
  local_320 = zzF;
  pdStack_318 = pdVar2;
  local_308 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0] = SVar7 + SVar6 + SVar5;
  local_338.m_value = 2;
  vStack_330.m_value = 0;
  local_320 = (Matrix3d *)&yzFr0t;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_350._0_8_ = pdVar1;
  local_340 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_340 = (XprTypeNested)0xbff0000000000000;
  local_320 = (Matrix3d *)0x2;
  pdStack_318 = (double *)0x0;
  local_300 = (Matrix3d *)&xyFr2t;
  local_310 = 1;
  local_338.m_value = (long)pdVar1;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)&R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  pdVar2 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_340 = (XprTypeNested)0xbff0000000000000;
  local_320 = (Matrix3d *)0x1;
  pdStack_318 = (double *)0x0;
  local_300 = (Matrix3d *)&zzFr0t;
  local_310 = 1;
  local_338.m_value = (long)pdVar2;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)&R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  local_338.m_value = 1;
  vStack_330.m_value = 0;
  local_320 = (Matrix3d *)&zxFr2t;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_350._0_8_ = pdVar2;
  local_340 = &R;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[4] = SVar11 + SVar10 + SVar9 + SVar8;
  local_338.m_value = 2;
  vStack_330.m_value = 0;
  local_320 = (Matrix3d *)&xyFr1t;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_350._0_8_ = pdVar1;
  local_340 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_300 = (Matrix3d *)&yyFr0t;
  local_340 = (XprTypeNested)0xbff0000000000000;
  local_320 = (Matrix3d *)0x2;
  pdStack_318 = (double *)0x0;
  local_310 = 1;
  local_338.m_value = (long)pdVar1;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)&R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_340 = (XprTypeNested)0xbff0000000000000;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_300 = (Matrix3d *)&zxFr1t;
  local_320 = (Matrix3d *)0x1;
  pdStack_318 = (double *)0x0;
  local_310 = 1;
  local_338.m_value = (long)pdVar1;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)&R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  local_338.m_value = 1;
  vStack_330.m_value = 0;
  local_320 = (Matrix3d *)&yzFr0t;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_350._0_8_ = pdVar1;
  local_340 = &R;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  local_320 = (Matrix3d *)&zzFr0t;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[8] = SVar11 + SVar10 + SVar9 + SVar8;
  local_338.m_value = 0;
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_350._0_8_ = &R;
  local_340 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_300 = (Matrix3d *)&zxFr2t;
  local_340 = (XprTypeNested)0xc000000000000000;
  local_320 = (Matrix3d *)0x0;
  pdStack_318 = (double *)0x0;
  local_310 = 1;
  local_338.m_value = (long)&R;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)&R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_350._0_8_ =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  local_338.m_value = 2;
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_300 = (Matrix3d *)0x2;
  local_2f8 = (double *)0x0;
  local_2f0 = 1;
  local_340 = &R;
  local_320 = xxF;
  pdStack_318 = (double *)local_350._0_8_;
  local_308 = &R;
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_320 = (Matrix3d *)&zxFr1t;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[5] = SVar5 + SVar9 + SVar8;
  local_338.m_value = 0;
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_350._0_8_ = &R;
  local_340 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_300 = (Matrix3d *)&yzFr0t;
  local_340 = (XprTypeNested)0xbff0000000000000;
  local_320 = (Matrix3d *)0x0;
  pdStack_318 = (double *)0x0;
  local_310 = 1;
  local_338.m_value = (long)&R;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)&R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_338.m_value =
       (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             + 2);
  local_340 = (XprTypeNested)0xbff0000000000000;
  local_320 = (Matrix3d *)0x2;
  pdStack_318 = (double *)0x0;
  local_300 = (Matrix3d *)&xxFr1t;
  local_310 = 1;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)&R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  local_320 = (Matrix3d *)&xyFr2t;
  local_338.m_value = 0;
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_350._0_8_ = &R;
  local_340 = &R;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  dVar4 = SVar11 + SVar10 + SVar9 + SVar8;
  local_350._0_8_ =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
  local_338.m_value = 1;
  vStack_330.m_value = 0;
  local_320 = (Matrix3d *)&xxFr1t;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[9] = dVar4;
  local_340 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_300 = (Matrix3d *)&xyFr1t;
  local_340 = (XprTypeNested)0xc000000000000000;
  local_320 = (Matrix3d *)0x0;
  pdStack_318 = (double *)0x0;
  local_310 = 1;
  local_338.m_value = (long)&R;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)&R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_320 = (Matrix3d *)&yyFr0t;
  local_338.m_value = 0;
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_350._0_8_ = &R;
  local_340 = &R;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[10] = SVar11 + SVar9 + SVar8;
  dVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[8];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[1] =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
       m_storage.m_data.array[4];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[2] = dVar3;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[6] = dVar4;
  local_338.m_value = 0;
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  Rowst.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4] = 0.0
  ;
  Rowst.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_350._0_8_ = &R;
  local_340 = &R;
  Rowst.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       (double)&Rows;
  Rowst.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)&Rows;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)&Rowst,
             (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_350);
  local_350._0_8_ =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
  local_338.m_value = 1;
  vStack_330.m_value = 0;
  Rowst.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       (double)(Rows.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.
                array + 3);
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  Rowst.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  Rowst.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_340 = &R;
  Rowst.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)&Rows;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)&Rowst,
             (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_350);
  local_350._0_8_ =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  local_338.m_value = 2;
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  Rowst.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       (double)(Rows.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.
                array + 6);
  Rowst.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4] =
       2.96439387504748e-323;
  Rowst.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_340 = &R;
  Rowst.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)&Rows;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)&Rowst,
             (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_350);
  local_350._0_8_ = &Rows;
  Eigen::PlainObjectBase<Eigen::Matrix<double,9,1,0,9,1>>::
  _set_noalias<Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((PlainObjectBase<Eigen::Matrix<double,9,1,0,9,1>> *)&Rowst,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)local_350);
  local_338.m_value = 0;
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x3;
  local_350._0_8_ = &R;
  local_340 = &R;
  x1PC.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)&Cols;
  x1PC.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)&Cols;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)&x1PC,
             (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)local_350);
  local_350._0_8_ =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 3;
  local_338.m_value = 0;
  x1PC.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)(Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                array + 3);
  vStack_330.m_value = 1;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x3;
  local_340 = &R;
  x1PC.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)&Cols;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)&x1PC,
             (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)local_350);
  local_350._0_8_ =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 6;
  local_338.m_value = 0;
  x1PC.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)(Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                array + 6);
  vStack_330.m_value = 2;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x3;
  local_340 = &R;
  x1PC.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)&Cols;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)&x1PC,
             (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)local_350);
  local_350._0_8_ = x1P;
  local_350._8_8_ = &Cols;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,9,0,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&x1PC,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
              *)local_350);
  local_350._0_8_ = y1P;
  local_350._8_8_ = &Cols;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,9,0,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&y1PC,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
              *)local_350);
  local_350._0_8_ = z1P;
  local_350._8_8_ = &Cols;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,9,0,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&z1PC,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
              *)local_350);
  local_350._0_8_ = x2P;
  local_350._8_8_ = &Rowst;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,9,0,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&x2PR,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
              *)local_350);
  local_350._0_8_ = y2P;
  local_350._8_8_ = &Rowst;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,9,0,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&y2PR,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
              *)local_350);
  local_350._0_8_ = z2P;
  local_350._8_8_ = &Rowst;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,9,0,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&z2PR,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
              *)local_350);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  local_338.m_value = 2;
  vStack_330.m_value = 0;
  local_320 = (Matrix3d *)&y1PC;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_350._0_8_ = pdVar1;
  local_340 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_338.m_value = 2;
  vStack_330.m_value = 0;
  local_320 = (Matrix3d *)&y2PR;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_350._0_8_ = pdVar1;
  local_340 = &R;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_300 = (Matrix3d *)&z1PC;
  local_340 = (XprTypeNested)0xbff0000000000000;
  local_320 = (Matrix3d *)0x1;
  pdStack_318 = (double *)0x0;
  local_310 = 1;
  local_338.m_value = (long)pdVar1;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)&R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_340 = (XprTypeNested)0xbff0000000000000;
  local_320 = (Matrix3d *)0x1;
  pdStack_318 = (double *)0x0;
  local_310 = 1;
  local_338.m_value = (long)pdVar1;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)&R;
  local_300 = (Matrix3d *)&z2PR;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  local_320 = (Matrix3d *)&z1PC;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xc] = SVar10 + SVar9 + SVar11 + SVar8;
  local_338.m_value = 0;
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_350._0_8_ = &R;
  local_340 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_338.m_value = 0;
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_350._0_8_ = &R;
  local_340 = &R;
  local_320 = (Matrix3d *)&z2PR;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  local_338.m_value =
       (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             + 2);
  local_340 = (XprTypeNested)0xbff0000000000000;
  local_320 = (Matrix3d *)0x2;
  pdStack_318 = (double *)0x0;
  local_300 = (Matrix3d *)&x1PC;
  local_310 = 1;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)&R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_338.m_value =
       (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             + 2);
  local_340 = (XprTypeNested)0xbff0000000000000;
  local_320 = (Matrix3d *)0x2;
  pdStack_318 = (double *)0x0;
  local_300 = (Matrix3d *)&x2PR;
  local_310 = 1;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)&R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  dVar3 = SVar10 + SVar9 + SVar11 + SVar8;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_320 = (Matrix3d *)&x1PC;
  local_338.m_value = 1;
  vStack_330.m_value = 0;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xd] = dVar3;
  local_350._0_8_ = pdVar1;
  local_340 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_338.m_value = 1;
  vStack_330.m_value = 0;
  local_320 = (Matrix3d *)&x2PR;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)0x1;
  local_350._0_8_ = pdVar1;
  local_340 = &R;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  local_300 = (Matrix3d *)&y1PC;
  local_340 = (XprTypeNested)0xbff0000000000000;
  local_320 = (Matrix3d *)0x0;
  pdStack_318 = (double *)0x0;
  local_310 = 1;
  local_338.m_value = (long)&R;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)&R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_350);
  local_340 = (XprTypeNested)0xbff0000000000000;
  local_300 = (Matrix3d *)&y2PR;
  local_320 = (Matrix3d *)0x0;
  pdStack_318 = (double *)0x0;
  local_310 = 1;
  local_338.m_value = (long)&R;
  pMStack_328 = (Matrix<double,_9,_9,_0,_9,_9> *)&R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  dVar4 = SVar10 + SVar9 + SVar11 + SVar8;
  local_340 = (XprTypeNested)0xbff0000000000000;
  pMStack_328 = m11P;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xe] = dVar4;
  local_338.m_value = (long)&Cols;
  local_320 = (Matrix3d *)&Cols;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  local_320 = (Matrix3d *)&Rowst;
  local_340 = (XprTypeNested)0xbff0000000000000;
  pMStack_328 = m22P;
  local_338.m_value = (long)&Rows;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  local_340 = (XprTypeNested)0xc000000000000000;
  pMStack_328 = m12P;
  local_338.m_value = (long)&Rows;
  local_320 = (Matrix3d *)&Cols;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_350);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xf] = SVar14 + SVar13 + SVar12;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[3] =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
       m_storage.m_data.array[0xc];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[7] = dVar3;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xb] = dVar4;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix4d
opengv::relative_pose::modules::ge::composeG(
  const Eigen::Matrix3d & xxF,
  const Eigen::Matrix3d & yyF,
  const Eigen::Matrix3d & zzF,
  const Eigen::Matrix3d & xyF,
  const Eigen::Matrix3d & yzF,
  const Eigen::Matrix3d & zxF,
  const Eigen::Matrix<double,3,9> & x1P,
  const Eigen::Matrix<double,3,9> & y1P,
  const Eigen::Matrix<double,3,9> & z1P,
  const Eigen::Matrix<double,3,9> & x2P,
  const Eigen::Matrix<double,3,9> & y2P,
  const Eigen::Matrix<double,3,9> & z2P,
  const Eigen::Matrix<double,9,9> & m11P,
  const Eigen::Matrix<double,9,9> & m12P,
  const Eigen::Matrix<double,9,9> & m22P,
  const cayley_t & cayley)
{
  Eigen::Matrix4d G;
  rotation_t R = math::cayley2rot_reduced(cayley);

  //todo: Fill the matrix G using the precomputed summation terms
  Eigen::Vector3d xxFr1t = xxF*R.row(1).transpose();
  Eigen::Vector3d yyFr0t = yyF*R.row(0).transpose();
  Eigen::Vector3d zzFr0t = zzF*R.row(0).transpose();
  Eigen::Vector3d yzFr0t = yzF*R.row(0).transpose();
  Eigen::Vector3d xyFr1t = xyF*R.row(1).transpose();
  Eigen::Vector3d xyFr2t = xyF*R.row(2).transpose();
  Eigen::Vector3d zxFr1t = zxF*R.row(1).transpose();
  Eigen::Vector3d zxFr2t = zxF*R.row(2).transpose();
  
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  G(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  G(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  G(0,0) += temp;

  temp =      R.row(2)*yzFr0t;
  G(0,1)  = temp;
  temp = -1.0*R.row(2)*xyFr2t;
  G(0,1) += temp;
  temp = -1.0*R.row(1)*zzFr0t;
  G(0,1) += temp;
  temp =      R.row(1)*zxFr2t;
  G(0,1) += temp;

  temp =      R.row(2)*xyFr1t;
  G(0,2)  = temp;
  temp = -1.0*R.row(2)*yyFr0t;
  G(0,2) += temp;
  temp = -1.0*R.row(1)*zxFr1t;
  G(0,2) += temp;
  temp =      R.row(1)*yzFr0t;
  G(0,2) += temp;

  temp =      R.row(0)*zzFr0t;
  G(1,1)  = temp;
  temp = -2.0*R.row(0)*zxFr2t;
  G(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  G(1,1) += temp;

  temp =      R.row(0)*zxFr1t;
  G(1,2)  = temp;
  temp = -1.0*R.row(0)*yzFr0t;
  G(1,2) += temp;
  temp = -1.0*R.row(2)*xxFr1t;
  G(1,2) += temp;
  temp =      R.row(0)*xyFr2t;
  G(1,2) += temp;

  temp =      R.row(1)*xxFr1t;
  G(2,2)  = temp;
  temp = -2.0*R.row(0)*xyFr1t;
  G(2,2) += temp;
  temp =      R.row(0)*yyFr0t;
  G(2,2) += temp;

  G(1,0) = G(0,1);
  G(2,0) = G(0,2);
  G(2,1) = G(1,2);

  //the generalized terms:
  Eigen::Matrix<double,1,9> Rows;
  Rows.block<1,3>(0,0) = R.row(0);
  Rows.block<1,3>(0,3) = R.row(1);
  Rows.block<1,3>(0,6) = R.row(2);
  Eigen::Matrix<double,9,1> Rowst = Rows.transpose();
  
  Eigen::Matrix<double,9,1> Cols;
  Cols.block<3,1>(0,0) = R.col(0);
  Cols.block<3,1>(3,0) = R.col(1);
  Cols.block<3,1>(6,0) = R.col(2);
  
  Eigen::Vector3d x1PC = x1P*Cols;
  Eigen::Vector3d y1PC = y1P*Cols;
  Eigen::Vector3d z1PC = z1P*Cols;
  
  Eigen::Vector3d x2PR = x2P*Rowst;
  Eigen::Vector3d y2PR = y2P*Rowst;
  Eigen::Vector3d z2PR = z2P*Rowst;
  
  temp =      R.row(2)*y1PC;
  G(0,3)  = temp;
  temp =      R.row(2)*y2PR;
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z1PC;
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z2PR;
  G(0,3) += temp;
  
  temp =      R.row(0)*z1PC;
  G(1,3)  = temp;
  temp =      R.row(0)*z2PR;
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x1PC;
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x2PR;
  G(1,3) += temp;
  
  temp =      R.row(1)*x1PC;
  G(2,3)  = temp;
  temp =      R.row(1)*x2PR;
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y1PC;
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y2PR;
  G(2,3) += temp;
  
  temp = -1.0*Cols.transpose()*m11P*Cols;
  G(3,3)  = temp;
  temp = -1.0*Rows*m22P*Rowst;
  G(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols;
  G(3,3) += temp;
  
  G(3,0) = G(0,3);
  G(3,1) = G(1,3);
  G(3,2) = G(2,3);

  return G;
}